

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmime_flbi.c
# Opt level: O1

void cmime_flbi_check_part_boundary(CMimePart_T *part)

{
  char *pcVar1;
  CMimeList_T *pCVar2;
  
  pCVar2 = part->headers;
  do {
    pCVar2 = (CMimeList_T *)pCVar2->head;
    if (pCVar2 == (CMimeList_T *)0x0) {
      return;
    }
    pcVar1 = cmime_header_get_value(*(CMimeHeader_T **)pCVar2,0);
    pcVar1 = cmime_flbi_get_boundary(pcVar1);
  } while (pcVar1 == (char *)0x0);
  part->boundary = pcVar1;
  return;
}

Assistant:

void cmime_flbi_check_part_boundary(CMimePart_T *part) {
    CMimeListElem_T *e = NULL;
    CMimeHeader_T *h = NULL;
    char *bound = NULL;

    e = cmime_list_head(part->headers);
    while(e != NULL) {
        h = (CMimeHeader_T *)cmime_list_data(e);

        bound = cmime_flbi_get_boundary(cmime_header_get_value(h,0));
        if (bound != NULL) {
            part->boundary = bound;
            break;
        }
        e = e->next;
    }
}